

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_run_optimize(roaring_bitmap_t *r)

{
  roaring_array_t *in_RDI;
  container_t *c1;
  container_t *c;
  uint8_t type_after;
  uint8_t type_original;
  int i;
  _Bool answer;
  uint8_t *in_stack_00000058;
  uint8_t in_stack_00000067;
  container_t *in_stack_00000068;
  container_t *in_stack_ffffffffffffffd8;
  roaring_array_t *in_stack_ffffffffffffffe0;
  uint8_t local_12;
  uint8_t local_11;
  int local_10;
  byte local_9;
  roaring_array_t *local_8;
  
  local_9 = 0;
  local_8 = in_RDI;
  for (local_10 = 0; local_10 < local_8->size; local_10 = local_10 + 1) {
    ra_unshare_container_at_index
              (in_stack_ffffffffffffffe0,(uint16_t)((ulong)in_stack_ffffffffffffffd8 >> 0x30));
    in_stack_ffffffffffffffe0 =
         (roaring_array_t *)ra_get_container_at_index(local_8,(uint16_t)local_10,&local_11);
    in_stack_ffffffffffffffd8 =
         convert_run_optimize(in_stack_00000068,in_stack_00000067,in_stack_00000058);
    if (local_12 == '\x03') {
      local_9 = 1;
    }
    ra_set_container_at_index(local_8,local_10,in_stack_ffffffffffffffd8,local_12);
  }
  return (_Bool)(local_9 & 1);
}

Assistant:

bool roaring_bitmap_run_optimize(roaring_bitmap_t *r) {
    bool answer = false;
    for (int i = 0; i < r->high_low_container.size; i++) {
        uint8_t type_original, type_after;
        ra_unshare_container_at_index(
            &r->high_low_container,
            (uint16_t)i);  // TODO: this introduces extra cloning!
        container_t *c = ra_get_container_at_index(&r->high_low_container,
                                                   (uint16_t)i, &type_original);
        container_t *c1 = convert_run_optimize(c, type_original, &type_after);
        if (type_after == RUN_CONTAINER_TYPE) {
            answer = true;
        }
        ra_set_container_at_index(&r->high_low_container, i, c1, type_after);
    }
    return answer;
}